

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleoption.h
# Opt level: O0

void __thiscall QStyleOptionTab::QStyleOptionTab(QStyleOptionTab *this,QStyleOptionTab *other)

{
  QStyleOptionTab *in_RSI;
  QStyleOptionTab *in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  
  QStyleOption::QStyleOption(&other->super_QStyleOption,unaff_retaddr_00,unaff_retaddr);
  QString::QString((QString *)0x44dee7);
  QIcon::QIcon(&in_RDI->icon);
  QFlags<QStyleOptionTab::CornerWidget>::QFlags((QFlags<QStyleOptionTab::CornerWidget> *)0x44df01);
  QSize::QSize((QSize *)in_RSI);
  QSize::QSize((QSize *)in_RSI);
  QSize::QSize((QSize *)in_RSI);
  QFlags<QStyleOptionTab::TabFeature>::QFlags((QFlags<QStyleOptionTab::TabFeature> *)0x44df3e);
  in_RDI->tabIndex = -1;
  operator=(in_RSI,in_RDI);
  return;
}

Assistant:

QStyleOptionTab(const QStyleOptionTab &other) : QStyleOption(Version, Type) { *this = other; }